

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::IsPopupOpen(ImGuiID id,ImGuiPopupFlags popup_flags)

{
  ulong uVar1;
  ImGuiID *pIVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  bool bVar9;
  
  if ((char)popup_flags < '\0') {
    iVar4 = (GImGui->OpenPopupStack).Size;
    if (((uint)popup_flags >> 8 & 1) == 0) {
      iVar3 = (GImGui->BeginPopupStack).Size;
      bVar9 = SBORROW4(iVar4,iVar3);
      bVar8 = iVar4 == iVar3;
      iVar4 = iVar4 - iVar3;
    }
    else {
      bVar9 = false;
      bVar8 = iVar4 == 0;
    }
    return !bVar8 && bVar9 == iVar4 < 0;
  }
  if (((uint)popup_flags >> 8 & 1) == 0) {
    iVar4 = (GImGui->BeginPopupStack).Size;
    if ((GImGui->OpenPopupStack).Size <= iVar4) {
      return false;
    }
    bVar8 = (GImGui->OpenPopupStack).Data[iVar4].PopupId == id;
  }
  else {
    uVar5 = (GImGui->OpenPopupStack).Size;
    uVar6 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar6 = 0;
    }
    uVar7 = 0;
    do {
      uVar1 = uVar7 + 0x30;
      bVar9 = uVar6 * 0x30 + 0x30 == uVar1;
      bVar8 = !bVar9;
      if (bVar9) {
        return bVar8;
      }
      pIVar2 = (ImGuiID *)((long)&((GImGui->OpenPopupStack).Data)->PopupId + uVar7);
      uVar7 = uVar1;
    } while (*pIVar2 != id);
  }
  return bVar8;
}

Assistant:

bool ImGui::IsPopupOpen(ImGuiID id, ImGuiPopupFlags popup_flags)
{
    ImGuiContext& g = *GImGui;
    if (popup_flags & ImGuiPopupFlags_AnyPopupId)
    {
        // Return true if any popup is open at the current BeginPopup() level of the popup stack
        // This may be used to e.g. test for another popups already opened to handle popups priorities at the same level.
        IM_ASSERT(id == 0);
        if (popup_flags & ImGuiPopupFlags_AnyPopupLevel)
            return g.OpenPopupStack.Size > 0;
        else
            return g.OpenPopupStack.Size > g.BeginPopupStack.Size;
    }
    else
    {
        if (popup_flags & ImGuiPopupFlags_AnyPopupLevel)
        {
            // Return true if the popup is open anywhere in the popup stack
            for (int n = 0; n < g.OpenPopupStack.Size; n++)
                if (g.OpenPopupStack[n].PopupId == id)
                    return true;
            return false;
        }
        else
        {
            // Return true if the popup is open at the current BeginPopup() level of the popup stack (this is the most-common query)
            return g.OpenPopupStack.Size > g.BeginPopupStack.Size && g.OpenPopupStack[g.BeginPopupStack.Size].PopupId == id;
        }
    }
}